

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/catch.hpp:9724:44)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_tests_catch_hpp:9724:44)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ConfigData *pCVar2;
  pointer pbVar3;
  char cVar4;
  istream *piVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  ParserResult *pPVar10;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  ifstream f;
  value_type local_2f0;
  string local_2d0;
  ParserResult *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined **local_268;
  undefined8 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248;
  undefined7 uStack_247;
  long local_238 [65];
  
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2b0 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_assign((string *)&local_2a8);
  local_258 = &local_248;
  local_260 = 0;
  local_268 = &PTR__BasicResult_001cad38;
  local_250 = 0;
  local_248 = 0;
  ::std::ifstream::ifstream((istream *)local_238,local_2a8._M_dataplus._M_p,_S_in);
  cVar4 = ::std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    local_2f0._M_string_length = 0;
    local_2f0.field_2._M_allocated_capacity =
         local_2f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    paVar1 = &local_2d0.field_2;
LAB_00139a72:
    do {
      cVar4 = ::std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
      piVar5 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2f0,cVar4);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_00139c33;
      trim(&local_2d0,&local_2f0);
      ::std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if (local_2f0._M_string_length != 0) {
        if (*local_2f0._M_dataplus._M_p != '\"') {
          if (*local_2f0._M_dataplus._M_p == '#') goto LAB_00139a72;
          ::std::operator+(&local_288,'\"',&local_2f0);
          puVar6 = (undefined8 *)
                   ::std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_288,local_288._M_string_length,0,'\x01');
          puVar7 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_2d0.field_2._M_allocated_capacity = *puVar7;
            local_2d0.field_2._8_8_ = puVar6[3];
            local_2d0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *puVar7;
            local_2d0._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_2d0._M_string_length = puVar6[1];
          *puVar6 = puVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_2d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&((this->m_lambda).config)->testsOrTags,&local_2f0);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &((this->m_lambda).config)->testsOrTags,(char (*) [2])",");
      }
    } while( true );
  }
  ::std::operator+(&local_2d0,"Unable to load input file: \'",&local_2a8);
  puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_2d0);
  pPVar10 = local_2b0;
  puVar7 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_2f0.field_2._M_allocated_capacity = *puVar7;
    local_2f0.field_2._8_4_ = *(undefined4 *)(puVar6 + 3);
    local_2f0.field_2._12_4_ = *(undefined4 *)((long)puVar6 + 0x1c);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = *puVar7;
    local_2f0._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_2f0._M_string_length = puVar6[1];
  *puVar6 = puVar7;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  (local_2b0->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type
       = RuntimeError;
  (local_2b0->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001cad38;
  (local_2b0->m_errorMessage)._M_dataplus._M_p = (pointer)&(local_2b0->m_errorMessage).field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0->m_errorMessage,local_2f0._M_dataplus._M_p,
             (char *)(local_2f0._M_string_length + (long)local_2f0._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  uVar8 = local_2d0.field_2._M_allocated_capacity;
  _Var9._M_p = local_2d0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p == &local_2d0.field_2) goto LAB_00139d10;
LAB_00139d08:
  operator_delete(_Var9._M_p,uVar8 + 1);
LAB_00139d10:
  ::std::ifstream::~ifstream(local_238);
  local_268 = &PTR__BasicResult_001cad38;
  if (local_258 != &local_248) {
    operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                             local_2a8.field_2._M_local_buf[0]) + 1);
  }
  return pPVar10;
LAB_00139c33:
  pCVar2 = (this->m_lambda).config;
  pbVar3 = (pCVar2->testsOrTags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pCVar2->testsOrTags).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pbVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&pCVar2->testsOrTags,pbVar3 + -1);
  }
  *(undefined8 *)
   &(local_2b0->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
    m_type = 0;
  (local_2b0->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001cad38;
  (local_2b0->m_errorMessage)._M_dataplus._M_p = (pointer)&(local_2b0->m_errorMessage).field_2;
  (local_2b0->m_errorMessage)._M_string_length = 0;
  (local_2b0->m_errorMessage).field_2._M_local_buf[0] = '\0';
  uVar8 = local_2f0.field_2._M_allocated_capacity;
  _Var9._M_p = local_2f0._M_dataplus._M_p;
  pPVar10 = local_2b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p == &local_2f0.field_2) goto LAB_00139d10;
  goto LAB_00139d08;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }